

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * askYesOrNo_abi_cxx11_(void)

{
  char cVar1;
  size_type sVar2;
  ostream *poVar3;
  string *in_RDI;
  char local_29;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)in_RDI,"abc","");
  sVar2 = in_RDI->_M_string_length;
  while (sVar2 != 0) {
    do {
      cVar1 = *(in_RDI->_M_dataplus)._M_p;
      if (cVar1 == 'n') goto LAB_0010537f;
      if (cVar1 == 'y') goto LAB_0010537f;
      std::operator>>((istream *)&std::cin,(string *)in_RDI);
      if (in_RDI->_M_string_length == 0) goto LAB_0010536d;
      cVar1 = *(in_RDI->_M_dataplus)._M_p;
    } while ((cVar1 == 'n') || (cVar1 == 'y'));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Type y or n.",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    sVar2 = in_RDI->_M_string_length;
  }
LAB_0010536d:
  do {
    std::__throw_out_of_range_fmt
              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0010537f:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Choice selected: ",0x11);
  } while (in_RDI->_M_string_length == 0);
  local_29 = *(in_RDI->_M_dataplus)._M_p;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_29,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return in_RDI;
}

Assistant:

string askYesOrNo() {
    string answer = "abc";
    while (answer.at(0) != 'y' && answer.at(0) != 'n') {
        cin >> answer;
        if (answer.at(0) != 'y' && answer.at(0) != 'n') cout << "Type y or n." << endl;
    }
    cout << "Choice selected: " << answer.at(0) << endl;
    return answer;
}